

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O2

ImVec4 ImPlot::GetAutoColor(ImPlotCol idx)

{
  ImVec4 IVar1;
  ImVec4 IVar2;
  ImPlotCol IVar3;
  ImVec4 *pIVar4;
  ImGuiCol idx_00;
  ImVec4 IVar5;
  
  switch(idx) {
  case 4:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xf:
  case 0x11:
  case 0x13:
    idx_00 = 0;
    break;
  case 5:
    idx_00 = 7;
    break;
  case 6:
    idx_00 = 2;
    break;
  case 7:
    idx_00 = 5;
    break;
  case 8:
    idx_00 = 4;
    break;
  case 9:
  case 0x17:
    IVar3 = 7;
    goto LAB_00308cc0;
  case 10:
    IVar3 = 0xc;
LAB_00308cc0:
    IVar5 = GetStyleColorVec4(IVar3);
    return IVar5;
  case 0xe:
    IVar3 = 0xd;
    goto LAB_00308cec;
  case 0x10:
    IVar3 = 0xf;
    goto LAB_00308cec;
  case 0x12:
    IVar3 = 0x11;
    goto LAB_00308cec;
  case 0x14:
    IVar3 = 0x13;
LAB_00308cec:
    IVar5 = GetStyleColorVec4(IVar3);
    IVar2.w = IVar5.w * 0.25;
    IVar2.z = IVar5.z;
    IVar2.x = (float)(int)IVar5._0_8_;
    IVar2.y = (float)(int)((ulong)IVar5._0_8_ >> 0x20);
    return IVar2;
  case 0x15:
    IVar1.z = 0.0;
    IVar1.w = 1.0;
    IVar1.x = 1.0;
    IVar1.y = 1.0;
    return IVar1;
  case 0x16:
    IVar5.z = 0.0;
    IVar5.w = 1.0;
    IVar5.x = 0.0;
    IVar5.y = 1.0;
    return IVar5;
  default:
    return (ImVec4)(ZEXT816(0x3f80000000000000) << 0x40);
  }
  pIVar4 = ImGui::GetStyleColorVec4(idx_00);
  return *pIVar4;
}

Assistant:

ImVec4 GetAutoColor(ImPlotCol idx) {
    ImVec4 col(0,0,0,1);
    switch(idx) {
        case ImPlotCol_Line:          return col; // these are plot dependent!
        case ImPlotCol_Fill:          return col; // these are plot dependent!
        case ImPlotCol_MarkerOutline: return col; // these are plot dependent!
        case ImPlotCol_MarkerFill:    return col; // these are plot dependent!
        case ImPlotCol_ErrorBar:      return ImGui::GetStyleColorVec4(ImGuiCol_Text);
        case ImPlotCol_FrameBg:       return ImGui::GetStyleColorVec4(ImGuiCol_FrameBg);
        case ImPlotCol_PlotBg:        return ImGui::GetStyleColorVec4(ImGuiCol_WindowBg);
        case ImPlotCol_PlotBorder:    return ImGui::GetStyleColorVec4(ImGuiCol_Border);
        case ImPlotCol_LegendBg:      return ImGui::GetStyleColorVec4(ImGuiCol_PopupBg);
        case ImPlotCol_LegendBorder:  return GetStyleColorVec4(ImPlotCol_PlotBorder);
        case ImPlotCol_LegendText:    return GetStyleColorVec4(ImPlotCol_InlayText);
        case ImPlotCol_TitleText:     return ImGui::GetStyleColorVec4(ImGuiCol_Text);
        case ImPlotCol_InlayText:     return ImGui::GetStyleColorVec4(ImGuiCol_Text);
        case ImPlotCol_XAxis:         return ImGui::GetStyleColorVec4(ImGuiCol_Text);
        case ImPlotCol_XAxisGrid:     return GetStyleColorVec4(ImPlotCol_XAxis) * ImVec4(1,1,1,0.25f);
        case ImPlotCol_YAxis:         return ImGui::GetStyleColorVec4(ImGuiCol_Text);
        case ImPlotCol_YAxisGrid:     return GetStyleColorVec4(ImPlotCol_YAxis) * ImVec4(1,1,1,0.25f);
        case ImPlotCol_YAxis2:        return ImGui::GetStyleColorVec4(ImGuiCol_Text);
        case ImPlotCol_YAxisGrid2:    return GetStyleColorVec4(ImPlotCol_YAxis2) * ImVec4(1,1,1,0.25f);
        case ImPlotCol_YAxis3:        return ImGui::GetStyleColorVec4(ImGuiCol_Text);
        case ImPlotCol_YAxisGrid3:    return GetStyleColorVec4(ImPlotCol_YAxis3) * ImVec4(1,1,1,0.25f);
        case ImPlotCol_Selection:     return ImVec4(1,1,0,1);
        case ImPlotCol_Query:         return ImVec4(0,1,0,1);
        case ImPlotCol_Crosshairs:    return GetStyleColorVec4(ImPlotCol_PlotBorder);
        default: return col;
    }
}